

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_pairing.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
::_remove_last(Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
               *this,Pos_index columnIndex)

{
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  reference pvVar4;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_48;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_40;
  iterator it;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_20;
  iterator it_1;
  Pos_index columnIndex_local;
  Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  *this_local;
  
  it_1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_ =
       columnIndex;
  if ((this->isReduced_ & 1U) != 0) {
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find(&this->deathToBar_,
                (key_type *)
                ((long)&it_1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur + 4));
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end(&this->deathToBar_);
    bVar1 = std::__detail::operator==(&local_20,&local_28);
    if (bVar1) {
      std::
      vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ::pop_back(&this->barcode_);
    }
    else {
      uVar2 = Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>
              ::get_null_value<unsigned_int>();
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_20);
      pvVar4 = std::
               vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
               ::operator[](&this->barcode_,(ulong)ppVar3->second);
      pvVar4->death = uVar2;
      it = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::erase(&this->deathToBar_,(iterator)local_20._M_cur);
    }
  }
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               *)this,(key_type *)
                      ((long)&it_1.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                              ._M_cur + 4));
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)this);
  bVar1 = std::__detail::operator!=(&local_40,&local_48);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> *
                        )&local_40);
    std::
    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::erase(&this->idToPosition_,&ppVar3->second);
    std::
    unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::erase((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             *)this,(iterator)local_40._M_cur);
  }
  return;
}

Assistant:

inline void Base_pairing<Master_matrix>::_remove_last(Pos_index columnIndex) 
{
  static_assert(Master_matrix::Option_list::has_removable_columns, "remove_last not available.");

  if (isReduced_) {
    auto it = deathToBar_.find(columnIndex);

    if (it == deathToBar_.end()) {  // birth
      barcode_.pop_back();          // sorted by birth and columnIndex has to be the highest one
    } else {                        // death
      barcode_[it->second].death = Master_matrix::template get_null_value<Pos_index>();
      deathToBar_.erase(it);
    };
  }

  auto it = PIDM::map_.find(columnIndex);
  if (it != PIDM::map_.end()){
    idToPosition_.erase(it->second);
    PIDM::map_.erase(it);
  }
}